

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O2

void __thiscall capnp::_::BuilderArena::~BuilderArena(BuilderArena *this)

{
  kj::Own<capnp::_::BuilderArena::MultiSegmentState>::dispose(&(this->moreSegments).ptr);
  LocalCapTable::~LocalCapTable(&this->localCapTable);
  return;
}

Assistant:

BuilderArena::~BuilderArena() noexcept(false) {}